

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encapsulation.cpp
# Opt level: O1

void __thiscall
Encapsulation_encapsulationWithMultipleRootHierarchy_Test::
~Encapsulation_encapsulationWithMultipleRootHierarchy_Test
          (Encapsulation_encapsulationWithMultipleRootHierarchy_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Encapsulation, encapsulationWithMultipleRootHierarchy)
{
    const std::string e =
        "<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n"
        "<model xmlns=\"http://www.cellml.org/cellml/2.0#\">\n"
        "  <component name=\"parent1_component\"/>\n"
        "  <component name=\"child11_component\"/>\n"
        "  <component name=\"child12_component\"/>\n"
        "  <component name=\"parent2_component\"/>\n"
        "  <component name=\"child21_component\"/>\n"
        "  <encapsulation>\n"
        "    <component_ref component=\"parent1_component\">\n"
        "      <component_ref component=\"child11_component\"/>\n"
        "      <component_ref component=\"child12_component\"/>\n"
        "    </component_ref>\n"
        "    <component_ref component=\"parent2_component\">\n"
        "      <component_ref component=\"child21_component\"/>\n"
        "    </component_ref>\n"
        "  </encapsulation>\n"
        "</model>\n";
    libcellml::ModelPtr model = libcellml::Model::create();
    libcellml::ComponentPtr parent1 = libcellml::Component::create();
    parent1->setName("parent1_component");
    libcellml::ComponentPtr parent2 = libcellml::Component::create();
    parent2->setName("parent2_component");
    libcellml::ComponentPtr child11 = libcellml::Component::create();
    child11->setName("child11_component");
    libcellml::ComponentPtr child12 = libcellml::Component::create();
    child12->setName("child12_component");
    libcellml::ComponentPtr child21 = libcellml::Component::create();
    child21->setName("child21_component");

    parent1->addComponent(child11);
    parent1->addComponent(child12);
    parent2->addComponent(child21);

    model->addComponent(parent1);
    model->addComponent(parent2);

    libcellml::PrinterPtr printer = libcellml::Printer::create();
    const std::string a = printer->printModel(model);
    EXPECT_EQ(e, a);
}